

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int emit_server_name_extension(ptls_buffer_t *buf,char *server_name)

{
  long lVar1;
  long lVar2;
  char *src;
  char *buf_00;
  size_t len;
  size_t body_size;
  size_t body_size_1;
  size_t body_start_1;
  size_t capacity_1;
  long local_30;
  size_t body_start;
  size_t capacity;
  char *pcStack_18;
  int ret;
  char *server_name_local;
  ptls_buffer_t *buf_local;
  
  body_start = 2;
  pcStack_18 = server_name;
  server_name_local = (char *)buf;
  capacity._4_4_ = ptls_buffer__do_pushv(buf,"",2);
  if (capacity._4_4_ == 0) {
    local_30 = *(long *)(server_name_local + 0x10);
    capacity_1._7_1_ = 0;
    capacity._4_4_ =
         ptls_buffer__do_pushv((ptls_buffer_t *)server_name_local,(void *)((long)&capacity_1 + 7),1)
    ;
    if (capacity._4_4_ == 0) {
      body_start_1 = 2;
      capacity._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)server_name_local,"",2);
      buf_00 = server_name_local;
      src = pcStack_18;
      if (capacity._4_4_ == 0) {
        lVar1 = *(long *)(server_name_local + 0x10);
        len = strlen(pcStack_18);
        capacity._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)buf_00,src,len);
        if (capacity._4_4_ == 0) {
          lVar2 = *(long *)(server_name_local + 0x10);
          for (; body_start_1 != 0; body_start_1 = body_start_1 - 1) {
            *(char *)(*(long *)server_name_local + (lVar1 - body_start_1)) =
                 (char)((ulong)(lVar2 - lVar1) >> (((char)body_start_1 + -1) * '\b' & 0x3fU));
          }
          lVar1 = *(long *)(server_name_local + 0x10);
          for (; body_start != 0; body_start = body_start - 1) {
            *(char *)(*(long *)server_name_local + (local_30 - body_start)) =
                 (char)((ulong)(lVar1 - local_30) >> (((char)body_start + -1) * '\b' & 0x3fU));
          }
          capacity._4_4_ = 0;
        }
      }
    }
  }
  return capacity._4_4_;
}

Assistant:

static int emit_server_name_extension(ptls_buffer_t *buf, const char *server_name)
{
    int ret;

    ptls_buffer_push_block(buf, 2, {
        ptls_buffer_push(buf, PTLS_SERVER_NAME_TYPE_HOSTNAME);
        ptls_buffer_push_block(buf, 2, { ptls_buffer_pushv(buf, server_name, strlen(server_name)); });
    });

    ret = 0;
Exit:
    return ret;
}